

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Value::removeIndex(Value *this,ArrayIndex index,Value *removed)

{
  ArrayIndex AVar1;
  iterator iVar2;
  Value *other;
  mapped_type *this_00;
  anon_union_4_2_4572b0f8_for_CZString_1 index_00;
  anon_union_4_2_4572b0f8_for_CZString_1 aVar3;
  bool bVar4;
  CZString keyLast;
  CZString key;
  key_type local_50;
  key_type local_40;
  
  if (*(char *)&this->bits_ == '\x06') {
    local_40.cstr_ = (char *)0x0;
    local_40.field_1.index_ = index;
    iVar2 = std::
            _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::find(&((this->value_).map_)->_M_t,&local_40);
    bVar4 = (_Rb_tree_header *)iVar2._M_node !=
            &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header;
    if (bVar4) {
      if (removed != (Value *)0x0) {
        operator=(removed,(Value *)&iVar2._M_node[1]._M_left);
      }
      AVar1 = size(this);
      aVar3.index_ = AVar1 - 1;
      if (index < aVar3.index_) {
        local_50.field_1.index_ = index;
        do {
          local_50.cstr_ = (char *)0x0;
          index_00.index_ = local_50.field_1.index_ + 1;
          other = operator[](this,index_00.index_);
          this_00 = std::
                    map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                    ::operator[]((this->value_).map_,&local_50);
          operator=(this_00,other);
          if ((local_50.cstr_ != (char *)0x0) && ((local_50.field_1.index_ & 3) == 1)) {
            free(local_50.cstr_);
          }
          local_50.field_1.index_ = index_00.index_;
        } while (aVar3.index_ != index_00.index_);
      }
      local_50.cstr_ = (char *)0x0;
      local_50.field_1.index_ = aVar3.index_;
      iVar2 = std::
              _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::find(&((this->value_).map_)->_M_t,&local_50);
      std::
      _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::_M_erase_aux(&((this->value_).map_)->_M_t,(const_iterator)iVar2._M_node);
      if ((local_50.cstr_ != (char *)0x0) && ((local_50.field_1.index_ & 3) == 1)) {
        free(local_50.cstr_);
      }
    }
    if ((local_40.cstr_ != (char *)0x0) && ((local_40.field_1.index_ & 3) == 1)) {
      free(local_40.cstr_);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Value::removeIndex(ArrayIndex index, Value* removed) {
  if (type() != arrayValue) {
    return false;
  }
  CZString key(index);
  auto it = value_.map_->find(key);
  if (it == value_.map_->end()) {
    return false;
  }
  if (removed)
    *removed = it->second;
  ArrayIndex oldSize = size();
  // shift left all items left, into the place of the "removed"
  for (ArrayIndex i = index; i < (oldSize - 1); ++i) {
    CZString keey(i);
    (*value_.map_)[keey] = (*this)[i + 1];
  }
  // erase the last one ("leftover")
  CZString keyLast(oldSize - 1);
  auto itLast = value_.map_->find(keyLast);
  value_.map_->erase(itLast);
  return true;
}